

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ExceptionOr<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>::
~ExceptionOr(ExceptionOr<kj::(anonymous_namespace)::ConcurrencyLimitingHttpClient::ConnectionCounter>
             *this)

{
  if ((this->value).ptr.isSet == true) {
    anon_unknown_36::ConcurrencyLimitingHttpClient::ConnectionCounter::~ConnectionCounter
              (&(this->value).ptr.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr() = default;